

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

RawHeadersList * __thiscall QNetworkHeadersPrivate::allRawHeaders(QNetworkHeadersPrivate *this)

{
  RawHeadersList *in_RDI;
  long in_FS_OFFSET;
  QList<std::pair<QByteArray,_QByteArray>_> *in_stack_ffffffffffffffb8;
  QList<std::pair<QByteArray,_QByteArray>_> *in_stack_ffffffffffffffc0;
  QHttpHeaders *headers;
  
  headers = *(QHttpHeaders **)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[1].d.d & 1) == 0) {
    fromHttpToRaw(headers);
    QList<std::pair<QByteArray,_QByteArray>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    QList<std::pair<QByteArray,_QByteArray>_>::~QList
              ((QList<std::pair<QByteArray,_QByteArray>_> *)0x1f3033);
    *(undefined1 *)&in_RDI[1].d.d = 1;
  }
  if (*(QHttpHeaders **)(in_FS_OFFSET + 0x28) != headers) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

const QNetworkHeadersPrivate::RawHeadersList &QNetworkHeadersPrivate::allRawHeaders() const
{
    if (rawHeaderCache.isCached)
        return rawHeaderCache.headersList;

    rawHeaderCache.headersList = fromHttpToRaw(httpHeaders);
    rawHeaderCache.isCached = true;
    return rawHeaderCache.headersList;
}